

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O3

void myutils::set_socket_nonblock(SOCKET socket,bool nonblock)

{
  uint uVar1;
  undefined7 in_register_00000031;
  
  uVar1 = fcntl(socket,3,0);
  fcntl(socket,4,(ulong)((int)CONCAT71(in_register_00000031,nonblock) << 0xb | uVar1 & 0xfffff7ff));
  return;
}

Assistant:

void set_socket_nonblock(SOCKET socket, bool nonblock)
    {
    #ifdef _WIN32
        unsigned long nNonBlocking = nonblock ? 1 : 0;
        if (ioctlsocket(socket, FIONBIO, &nNonBlocking) == SOCKET_ERROR)
            assert(false);
    #else
        int flags = fcntl(socket, F_GETFL, 0);
	if (nonblock)
            flags |= O_NONBLOCK;
        else
            flags &= ~O_NONBLOCK;  
        fcntl(socket, F_SETFL, flags);
    #endif
    }